

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdWiden<wabt::interp::Simd<int,(unsigned_char)4>,wabt::interp::Simd<short,(unsigned_char)8>,false>
          (Thread *this)

{
  u8 i;
  long lVar1;
  Simd<int,_(unsigned_char)__x04_> result;
  Simd<short,_(unsigned_char)__b_> val;
  Simd<int,_(unsigned_char)__x04_> local_28;
  short local_18 [8];
  
  local_18 = (short  [8])Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  lVar1 = 0;
  do {
    local_28.v[lVar1] = (int)local_18[lVar1 + 4];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  Push<wabt::interp::Simd<int,(unsigned_char)4>>(this,local_28);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdWiden() {
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = val[(low ? 0 : S::lanes) + i];
  }
  Push(result);
  return RunResult::Ok;
}